

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::
make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator()(make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,stringstream *msg,char *arg,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *msg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  make_exception<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_28 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  std::operator<<((ostream *)(msg + 0x10),arg);
  msg_00 = arg_local;
  std::__cxx11::string::string((string *)&local_50,(string *)args);
  make_exception<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(&local_29,(stringstream *)msg_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }